

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

void __thiscall OpenMD::SelectionEvaluator::SelectionEvaluator(SelectionEvaluator *this,SimInfo *si)

{
  _Rb_tree_header *p_Var1;
  vector<int,_std::allocator<int>_> *this_00;
  int local_3c;
  NameFinder *local_38;
  
  SelectionCompiler::SelectionCompiler(&this->compiler);
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->script)._M_dataplus._M_p = (pointer)&(this->script).field_2;
  (this->script)._M_string_length = 0;
  (this->script).field_2._M_local_buf[0] = '\0';
  this->error = false;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aatoken).
  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->errorMessage)._M_dataplus._M_p = (pointer)&(this->errorMessage).field_2;
  (this->errorMessage)._M_string_length = 0;
  (this->errorMessage).field_2._M_local_buf[0] = '\0';
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->statement).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->info = si;
  NameFinder::NameFinder(&this->nameFinder,si);
  local_38 = &this->nameFinder;
  DistanceFinder::DistanceFinder(&this->distanceFinder,this->info);
  HullFinder::HullFinder(&this->hullFinder,this->info);
  AlphaHullFinder::AlphaHullFinder(&this->alphaHullFinder,this->info);
  IndexFinder::IndexFinder(&this->indexFinder,this->info);
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nObjects).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  this->hasVolume_ = false;
  (this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)((long)&(this->variables)._M_t._M_impl.super__Rb_tree_header._M_node_count + 7) = 0
  ;
  this_00 = &this->nObjects;
  local_3c = this->info->nGlobalRigidBodies_ + this->info->nGlobalAtoms_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = this->info->nGlobalBonds_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = this->info->nGlobalBends_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = this->info->nGlobalTorsions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = this->info->nGlobalInversions_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  local_3c = this->info->nGlobalMols_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_3c);
  return;
}

Assistant:

SelectionEvaluator::SelectionEvaluator(SimInfo* si) :
      info(si), nameFinder(info), distanceFinder(info), hullFinder(info),
      alphaHullFinder(info), indexFinder(info), isLoaded_(false),
      hasSurfaceArea_(false), hasVolume_(false) {
    nObjects.push_back(info->getNGlobalAtoms() + info->getNGlobalRigidBodies());
    nObjects.push_back(info->getNGlobalBonds());
    nObjects.push_back(info->getNGlobalBends());
    nObjects.push_back(info->getNGlobalTorsions());
    nObjects.push_back(info->getNGlobalInversions());
    nObjects.push_back(info->getNGlobalMolecules());
  }